

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::Min::forward_dev_impl<dynet::Device_CPU>
          (Min *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar1;
  Tensor t;
  TensorCwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
  local_d0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a8;
  DefaultDevice *local_98;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *local_90;
  undefined1 local_88 [48];
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_58;
  Device *local_40;
  DeviceMempool local_38;
  
  local_88._32_4_ = (fx->d).bd;
  local_88._40_8_ = (this->super_Node).aux_mem;
  local_40 = fx->device;
  local_88._0_8_ = *(undefined8 *)(fx->d).d;
  local_88._8_8_ = *(undefined8 *)((fx->d).d + 2);
  local_88._16_8_ = *(undefined8 *)((fx->d).d + 4);
  local_88._24_8_ = *(undefined8 *)((fx->d).d + 6);
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = FXS;
  TVar1 = Tensor::tvec(*(xs->
                        super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  local_d0.m_rhs_xpr =
       Tensor::tvec((xs->
                    super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]);
  local_d0.m_lhs_xpr = TVar1;
  local_a8 = Tensor::tvec((Tensor *)local_88);
  local_98 = dev->edevice;
  local_90 = &local_a8;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
               *)&local_98,
              (TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)&local_d0);
  TVar1 = Tensor::tvec(*(xs->
                        super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  local_d0.m_rhs_xpr =
       Tensor::tvec((xs->
                    super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]);
  local_d0.m_lhs_xpr = TVar1;
  local_a8 = Tensor::tvec(fx);
  local_98 = dev->edevice;
  local_90 = &local_a8;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
               *)&local_98,&local_d0);
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_58);
  return;
}

Assistant:

void Min::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  Tensor t(fx.d, static_cast<float*>(aux_mem), fx.device, DeviceMempool::FXS);
  t.tvec().device(*dev.edevice) = (xs[0]->tvec() < xs[1]->tvec()).cast<float>();
  fx.tvec().device(*dev.edevice) = xs[0]->tvec().cwiseMin(xs[1]->tvec());
}